

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O3

BBox<1> Omega_h::
        transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<1>,Omega_h::BBox<1>,Omega_h::UniteOp<1>>
                  (Few<double,_1> param_1,Few<double,_1> param_2,int first,int last,ulong *param_5)

{
  int *piVar1;
  Few<double,_1> FVar2;
  ulong uVar3;
  Few<double,_1> FVar4;
  long lVar5;
  Alloc *this;
  BBox<1> BVar6;
  
  this = (Alloc *)*param_5;
  uVar3 = param_5[1];
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    this->use_count = this->use_count + -1;
    this = (Alloc *)(this->size * 8 + 1);
  }
  *param_5 = 0;
  param_5[1] = 0;
  entering_parallel = 0;
  if (last != first) {
    lVar5 = 0;
    do {
      FVar2.array_[0] = *(double (*) [1])(uVar3 + (long)first * 8 + lVar5 * 8);
      FVar4.array_[0] = FVar2.array_[0];
      if ((double)param_1.array_[0] <= (double)FVar2.array_[0]) {
        FVar4.array_[0] = param_1.array_[0];
      }
      param_1.array_[0] = FVar4.array_[0];
      if ((double)FVar2.array_[0] <= (double)param_2.array_[0]) {
        FVar2.array_[0] = param_2.array_[0];
      }
      param_2.array_[0] = FVar2.array_[0];
      lVar5 = lVar5 + 1;
    } while (last - first != (int)lVar5);
  }
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  BVar6.max.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)param_2.array_[0];
  BVar6.min.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)param_1.array_[0];
  return BVar6;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}